

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall ACSStringPool::InsertString(ACSStringPool *this,FString *str,uint h,uint bucketnum)

{
  PoolEntry *pPVar1;
  uint uVar2;
  
  uVar2 = this->FirstFreeEntry;
  if (99 < uVar2) {
    if (uVar2 == (this->Pool).Most) {
      P_CollectACSGlobalStrings();
      uVar2 = this->FirstFreeEntry;
    }
    if (0x7fefffff < uVar2) {
      return -1;
    }
  }
  if (uVar2 == (this->Pool).Count) {
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve(&this->Pool,1);
    this->FirstFreeEntry = this->FirstFreeEntry + 1;
  }
  else {
    FindFirstFreeEntry(this,uVar2 + 1);
  }
  pPVar1 = (this->Pool).Array;
  FString::operator=(&pPVar1[uVar2].Str,str);
  pPVar1[uVar2].Hash = h;
  pPVar1[uVar2].Next = this->PoolBuckets[bucketnum];
  pPVar1[uVar2].LockCount = 0;
  this->PoolBuckets[bucketnum] = uVar2;
  return uVar2 | 0x7ff00000;
}

Assistant:

int ACSStringPool::InsertString(FString &str, unsigned int h, unsigned int bucketnum)
{
	unsigned int index = FirstFreeEntry;
	if (index >= MIN_GC_SIZE && index == Pool.Max())
	{ // We will need to grow the array. Try a garbage collection first.
		P_CollectACSGlobalStrings();
		index = FirstFreeEntry;
	}
	if (FirstFreeEntry >= STRPOOL_LIBRARYID_OR)
	{ // If we go any higher, we'll collide with the library ID marker.
		return -1;
	}
	if (index == Pool.Size())
	{ // There were no free entries; make a new one.
		Pool.Reserve(1);
		FirstFreeEntry++;
	}
	else
	{ // Scan for the next free entry
		FindFirstFreeEntry(FirstFreeEntry + 1);
	}
	PoolEntry *entry = &Pool[index];
	entry->Str = str;
	entry->Hash = h;
	entry->Next = PoolBuckets[bucketnum];
	entry->LockCount = 0;
	PoolBuckets[bucketnum] = index;
	return index | STRPOOL_LIBRARYID_OR;
}